

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::ShapeHandle::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,ShapeHandle *this,Ray *ray,
          Float tMax)

{
  ulong uVar1;
  uint uVar2;
  Sphere *this_00;
  Curve *this_01;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          ).bits;
  uVar2 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    this_00 = (Sphere *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x31 == 0) {
      Sphere::Intersect(__return_storage_ptr__,this_00,ray,tMax);
    }
    else if (uVar2 == 2) {
      Cylinder::Intersect(__return_storage_ptr__,(Cylinder *)this_00,ray,tMax);
    }
    else {
      Disk::Intersect(__return_storage_ptr__,(Disk *)this_00,ray,tMax);
    }
  }
  else {
    uVar2 = uVar2 - 3;
    this_01 = (Curve *)(uVar1 & 0xffffffffffff);
    if (uVar2 < 2) {
      Triangle::Intersect(__return_storage_ptr__,(Triangle *)this_01,ray,tMax);
    }
    else if (uVar2 == 2) {
      BilinearPatch::Intersect(__return_storage_ptr__,(BilinearPatch *)this_01,ray,tMax);
    }
    else {
      Curve::Intersect(__return_storage_ptr__,this_01,ray,tMax);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline pstd::optional<ShapeIntersection> ShapeHandle::Intersect(const Ray &ray,
                                                                Float tMax) const {
    auto intr = [&](auto ptr) { return ptr->Intersect(ray, tMax); };
    return Dispatch(intr);
}